

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

bool jbcoin::STObject::equivalentSTObjectSameTemplate(STObject *obj1,STObject *obj2)

{
  pointer pSVar1;
  pointer pSVar2;
  STBase *pSVar3;
  STBase *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  STBase **ppSVar8;
  pointer pSVar9;
  
  if (obj1->mType == (SOTemplate *)0x0) {
    __assert_fail("obj1.mType != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fc,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  if (obj1->mType != obj2->mType) {
    __assert_fail("obj1.mType == obj2.mType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fd,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  pSVar9 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar1 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pSVar2 = (obj2->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)pSVar9 - (long)pSVar1 ==
      (long)pSVar2 -
      (long)(obj2->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = true;
    if (pSVar9 != pSVar1) {
      ppSVar8 = &pSVar2->p_;
      do {
        pSVar3 = pSVar9->p_;
        pSVar4 = *ppSVar8;
        iVar6 = (*pSVar3->_vptr_STBase[4])(pSVar3);
        iVar7 = (*pSVar4->_vptr_STBase[4])(pSVar4);
        if (iVar6 != iVar7) goto LAB_001b404a;
        iVar6 = (*pSVar3->_vptr_STBase[9])(pSVar3,pSVar4);
        if ((char)iVar6 == '\0') goto LAB_001b404a;
        pSVar9 = pSVar9 + 1;
        ppSVar8 = ppSVar8 + 0xc;
      } while (pSVar9 != pSVar1);
      bVar5 = true;
    }
  }
  else {
LAB_001b404a:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool STObject::equivalentSTObjectSameTemplate (
    STObject const& obj1, STObject const& obj2)
{
    assert (obj1.mType != nullptr);
    assert (obj1.mType == obj2.mType);

    return std::equal (obj1.begin (), obj1.end (), obj2.begin (), obj2.end (),
        [] (STBase const& st1, STBase const& st2)
        {
            return (st1.getSType() == st2.getSType()) &&
                st1.isEquivalent (st2);
        });
}